

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

int __thiscall Node::OutputPrintData(Node *this,ostream *os,int InputFlag)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  string local_60;
  string local_40;
  
  while (iVar1 = this->Type, iVar1 == 0x1f5) {
    if (this->Tree[0] == (Node *)0x0) {
      bVar3 = true;
    }
    else {
      iVar1 = OutputPrintData(this->Tree[0],os,InputFlag);
      bVar3 = iVar1 != 2;
    }
    if (((bVar3) && (*(this->TextValue)._M_dataplus._M_p == ',')) && (IOUsing == (Node *)0x0)) {
      OutputIPChannel(this,os,InputFlag);
      std::operator<<(os," << \'\\t\'");
    }
    this = this->Tree[1];
    if (this == (Node *)0x0) {
      return 0;
    }
  }
  if (iVar1 == 0x23) {
    IOChannel = this;
    return 2;
  }
  if (iVar1 != 0x1b1) {
    if (iVar1 == 0x1d4) {
      OutputIPChannel(this,os,0);
      if (IOUsing == (Node *)0x0) {
        poVar2 = std::operator<<(os," << ");
        Expression_abi_cxx11_(&local_60,this);
        std::operator<<(poVar2,(string *)&local_60);
LAB_001154cc:
        std::__cxx11::string::~string((string *)&local_60);
        return 1;
      }
      poVar2 = std::operator<<(os," << PUse.Output(");
      Expression_abi_cxx11_(&local_60,this);
      poVar2 = std::operator<<(poVar2,(string *)&local_60);
      poVar2 = std::operator<<(poVar2,");");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      if (iVar1 == 0x206) {
        OutputIPChannel(this,os,InputFlag);
        poVar2 = std::operator<<(os," << RECORD(");
        Expression_abi_cxx11_(&local_60,this->Tree[0]);
        poVar2 = std::operator<<(poVar2,(string *)&local_60);
        std::operator<<(poVar2,")");
        goto LAB_001152fd;
      }
      iVar1 = CheckCpos(this);
      if (iVar1 != 0) {
        poVar2 = std::operator<<(os,";");
        std::endl<char,std::char_traits<char>>(poVar2);
        IOChPrinted = 0;
      }
      OutputIPChannel(this,os,InputFlag);
      if (IOUsing == (Node *)0x0) {
        iVar1 = IsNumber(this);
        if (iVar1 == 0) {
          poVar2 = std::operator<<(os," << ");
          Expression_abi_cxx11_(&local_60,this);
          std::operator<<(poVar2,(string *)&local_60);
        }
        else {
          poVar2 = std::operator<<(os," << \' \'");
          poVar2 = std::operator<<(poVar2," << ");
          Expression_abi_cxx11_(&local_60,this);
          poVar2 = std::operator<<(poVar2,(string *)&local_60);
          std::operator<<(poVar2," << \' \'");
        }
        goto LAB_001154cc;
      }
      poVar2 = std::operator<<(os," << PUse.Output(");
      Expression_abi_cxx11_(&local_60,this);
      poVar2 = std::operator<<(poVar2,(string *)&local_60);
      poVar2 = std::operator<<(poVar2,");");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::~string((string *)&local_60);
    IOChPrinted = 0;
    return 1;
  }
  IOUsing = this->Tree[0];
  Indent_abi_cxx11_(&local_60,this);
  poVar2 = std::operator<<(os,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,"PUse.SetFormat(");
  Expression_abi_cxx11_(&local_40,IOUsing);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,");");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
LAB_001152fd:
  std::__cxx11::string::~string((string *)&local_60);
  return 2;
}

Assistant:

int Node::OutputPrintData(
	std::ostream& os,	/**< Channel to write C++ code to */
	int InputFlag		/**< Specifies if it is working on 
				 * an input statement, ie. specifies the 
				 * direction of the arrows. 
				 */
)
{
	int ReturnFlag;		// Does a return seem to be needed
				//   Gets set to one if the print/Input command
				//   ends with a ',' or ';'.
	int TestFlag = 0;	// Test for special item

	//
	// Is this a piece of a list?
	//
	switch (Type)
	{
	case BAS_N_LIST:
		//
		// Try the left side of the tree
		//
		if (Tree[0] != 0)
		{
			TestFlag = Tree[0]->OutputPrintData(os, InputFlag);
		}

		//
		// Do we need to append a tab between fields?
		// Only do so for print statements.
		//
		if ((TextValue[0] == ',') &&
			(TestFlag != 2) && (IOUsing == 0))
		{
			OutputIPChannel(os, InputFlag);
			os << " << '\\t'";
		}

		//
		// Handle right side of the tree
		//
		if (Tree[1] != 0)
		{
			ReturnFlag = Tree[1]->OutputPrintData(os, InputFlag);
		}
		else
		{
			ReturnFlag = 0;
		}

		break;

	case '#':
		IOChannel = this;
		ReturnFlag = 2;
		break;

	case BAS_S_USING:
		IOUsing = Tree[0];
		ReturnFlag = 2;

		os << Indent() << "PUse.SetFormat(" << IOUsing->Expression() <<
			");" << std::endl;

		break;

	case BAS_N_RECORD:
		OutputIPChannel(os, InputFlag);
		os << " << RECORD(" << Tree[0]->Expression() << ")";
		ReturnFlag = 2;
		break;

	case BAS_V_TEXTSTRING:
		OutputIPChannel(os, 0);

		//
		// Put a comma in print using statements, else
		// out out a '<<'.
		//
		if (IOUsing != 0)
		{
			os << " << PUse.Output(" << Expression() << ");" << std::endl;
			IOChPrinted = 0;
		}
		else
		{
			os << " << " << Expression();
		}
		ReturnFlag = 1;

		break;


	default:


		//
		// Print
		//
		if (CheckCpos())
		{
			//
			// If we have an item that needs the current
			// cursor position to be correct, we have to put
			// it at tyhe beginning of an output statement
			//
			os << ";" << std::endl;
			IOChPrinted = 0;
		}

		OutputIPChannel(os, InputFlag);

		//
		// Put a comma in print using statements, else
		// out out a '<<'.
		//
		if (IOUsing != 0)
		{
			os << " << PUse.Output(" << Expression() << ");" << std::endl;
			IOChPrinted = 0;
		}
		else
		{
			if (IsNumber() != 0)
			{
				//
				// Basic puts either a '-' or a ' ' in front
				// of numbers, and as ' ' after the number.
				//
				// \note we are assuming positive numbers only,
				// because dealing with negitive ones gets ug;y
				// really fast.
				//
				os << " << ' '" <<
					" << " << Expression() <<
					" << ' '";
			}
			else
			{
				os << " << " << Expression();
			}
		}
		ReturnFlag = 1;
		break;
	}

	//
	// Done
	//
	return ReturnFlag;
}